

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O3

void duckdb::StringDetection(string *str_1,string *str_2,string *name_str_1,string *name_str_2)

{
  pointer pcVar1;
  long lVar2;
  BinderException *this;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((str_1->_M_string_length != 0) && (str_2->_M_string_length != 0)) {
    lVar2 = ::std::__cxx11::string::find((char *)str_2,(ulong)(str_1->_M_dataplus)._M_p,0);
    if (lVar2 != -1) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"%s must not appear in the %s specification and vice versa","")
      ;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (name_str_1->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + name_str_1->_M_string_length);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (name_str_2->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + name_str_2->_M_string_length);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (this,&local_90,&local_50,&local_70);
      __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void StringDetection(const string &str_1, const string &str_2, const string &name_str_1, const string &name_str_2) {
	if (str_1.empty() || str_2.empty()) {
		return;
	}
	if (str_2.find(str_1) != string::npos) {
		throw BinderException("%s must not appear in the %s specification and vice versa", name_str_1, name_str_2);
	}
}